

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O0

float If_CutDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  char *pcVar1;
  If_Cut_t *pIVar2;
  float (*pafVar3) [33];
  bool bVar4;
  float fVar5;
  float local_88;
  float local_70;
  int local_6c;
  int local_68;
  float local_60;
  float local_58;
  float local_54;
  uint local_48;
  int Pin2PinDelay;
  int Shift;
  int i;
  float *pLutDelays;
  float DelayCur;
  float Delay;
  If_Obj_t *pLeaf;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  pcVar1 = If_CutPerm(pCut);
  pLutDelays._4_4_ = -1e+20;
  if ((*(uint *)&pCut->field_0x1c >> 0xf & 1) == 0) {
    if (p->pPars->pLutLib == (If_LibLut_t *)0x0) {
      if ((*(uint *)&pCut->field_0x1c >> 0xd & 1) == 0) {
        if (p->pPars->fLiftLeaves == 0) {
          Pin2PinDelay = 0;
          while( true ) {
            bVar4 = false;
            if (Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
              _DelayCur = If_ManObj(p,(int)(&pCut[1].Area)[Pin2PinDelay]);
              bVar4 = _DelayCur != (If_Obj_t *)0x0;
            }
            if (!bVar4) break;
            pIVar2 = If_ObjCutBest(_DelayCur);
            local_88 = pIVar2->Delay + 1.0;
            if (local_88 < pLutDelays._4_4_) {
              local_88 = pLutDelays._4_4_;
            }
            pLutDelays._4_4_ = local_88;
            Pin2PinDelay = Pin2PinDelay + 1;
          }
        }
        else {
          Pin2PinDelay = 0;
          while( true ) {
            bVar4 = false;
            if (Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
              _DelayCur = If_ManObj(p,(int)(&pCut[1].Area)[Pin2PinDelay] >> 8);
              bVar4 = false;
              if (_DelayCur != (If_Obj_t *)0x0) {
                local_48 = (uint)(&pCut[1].Area)[Pin2PinDelay] & 0xff;
                bVar4 = -1 < (int)local_48;
              }
            }
            if (!bVar4) break;
            pIVar2 = If_ObjCutBest(_DelayCur);
            fVar5 = pIVar2->Delay - (float)(int)(local_48 * p->Period);
            if (pLutDelays._4_4_ <= fVar5 + 1.0) {
              pLutDelays._4_4_ = fVar5 + 1.0;
            }
            Pin2PinDelay = Pin2PinDelay + 1;
          }
        }
      }
      else {
        if (p->pPars->fLiftLeaves != 0) {
          __assert_fail("!p->pPars->fLiftLeaves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                        ,0x88,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
        }
        Pin2PinDelay = 0;
        while( true ) {
          bVar4 = false;
          if (Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            _DelayCur = If_ManObj(p,(int)(&pCut[1].Area)[Pin2PinDelay]);
            bVar4 = _DelayCur != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          if (pcVar1 == (char *)0x0) {
            local_6c = 1;
          }
          else {
            if (pcVar1[Pin2PinDelay] == 'x') {
              local_68 = -0x78;
            }
            else {
              local_68 = (int)pcVar1[Pin2PinDelay];
            }
            local_6c = local_68;
          }
          pIVar2 = If_ObjCutBest(_DelayCur);
          local_70 = pIVar2->Delay + (float)local_6c;
          if (local_70 < pLutDelays._4_4_) {
            local_70 = pLutDelays._4_4_;
          }
          pLutDelays._4_4_ = local_70;
          Pin2PinDelay = Pin2PinDelay + 1;
        }
      }
    }
    else {
      if (p->pPars->fLiftLeaves != 0) {
        __assert_fail("!p->pPars->fLiftLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                      ,0x6f,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      pafVar3 = p->pPars->pLutLib->pLutDelays + (*(uint *)&pCut->field_0x1c >> 0x18);
      if (p->pPars->pLutLib->fVarPinDelays == 0) {
        Pin2PinDelay = 0;
        while( true ) {
          bVar4 = false;
          if (Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            _DelayCur = If_ManObj(p,(int)(&pCut[1].Area)[Pin2PinDelay]);
            bVar4 = _DelayCur != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          pIVar2 = If_ObjCutBest(_DelayCur);
          local_60 = pIVar2->Delay + (*pafVar3)[0];
          if (local_60 < pLutDelays._4_4_) {
            local_60 = pLutDelays._4_4_;
          }
          pLutDelays._4_4_ = local_60;
          Pin2PinDelay = Pin2PinDelay + 1;
        }
      }
      else {
        If_CutSortInputPins(p,pCut,If_CutDelay::pPinPerm,If_CutDelay::pPinDelays);
        for (Pin2PinDelay = 0; Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18);
            Pin2PinDelay = Pin2PinDelay + 1) {
          local_58 = If_CutDelay::pPinDelays[If_CutDelay::pPinPerm[Pin2PinDelay]] +
                     (*pafVar3)[Pin2PinDelay];
          if (local_58 < pLutDelays._4_4_) {
            local_58 = pLutDelays._4_4_;
          }
          pLutDelays._4_4_ = local_58;
        }
      }
    }
  }
  else {
    Pin2PinDelay = 0;
    while( true ) {
      bVar4 = false;
      if (Pin2PinDelay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
        _DelayCur = If_ManObj(p,(int)(&pCut[1].Area)[Pin2PinDelay]);
        bVar4 = _DelayCur != (If_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pIVar2 = If_ObjCutBest(_DelayCur);
      local_54 = pIVar2->Delay + (float)p->pPars->nAndDelay;
      if (local_54 < pLutDelays._4_4_) {
        local_54 = pLutDelays._4_4_;
      }
      pLutDelays._4_4_ = local_54;
      Pin2PinDelay = Pin2PinDelay + 1;
    }
  }
  return pLutDelays._4_4_;
}

Assistant:

float If_CutDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    char * pPerm = If_CutPerm( pCut );
    If_Obj_t * pLeaf;
    float Delay, DelayCur;
    float * pLutDelays;
    int i, Shift, Pin2PinDelay;//, iLeaf;
    Delay = -IF_FLOAT_LARGE;
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
        {
            DelayCur = If_ObjCutBest(pLeaf)->Delay + p->pPars->nAndDelay;
            Delay = IF_MAX( Delay, DelayCur );
        }
    }
    else if ( p->pPars->pLutLib )
    {
        assert( !p->pPars->fLiftLeaves );
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                DelayCur = pPinDelays[pPinPerm[i]] + pLutDelays[i];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                DelayCur = If_ObjCutBest(pLeaf)->Delay + pLutDelays[0];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            assert( !p->pPars->fLiftLeaves );
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                DelayCur = If_ObjCutBest(pLeaf)->Delay + (float)Pin2PinDelay;
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            if ( p->pPars->fLiftLeaves )
            {
                If_CutForEachLeafSeq( p, pCut, pLeaf, Shift, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay - Shift * p->Period;
                    Delay = IF_MAX( Delay, DelayCur + 1.0 );
                }
            }
            else
            {
                If_CutForEachLeaf( p, pCut, pLeaf, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay + 1.0;
                    Delay = IF_MAX( Delay, DelayCur );
                }
            }
        }
    }
    return Delay;
}